

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_simplex.cc
# Opt level: O2

double extrapolate4(osn_context *ctx,int xsb,int ysb,int zsb,int wsb,double dx,double dy,double dz,
                   double dw)

{
  int16_t *piVar1;
  ulong uVar2;
  
  piVar1 = ctx->perm;
  uVar2 = (ulong)((ushort)piVar1[(uint)(ushort)piVar1[(uint)(ushort)piVar1[(uint)(ushort)piVar1[xsb 
                                                  & 0xff] + ysb & 0xff] + zsb & 0xff] + wsb & 0xff]
                 & 0xfc);
  return dx * (double)(int)gradients4D[uVar2] + (double)(int)gradients4D[uVar2 + 1] * dy +
         (double)(int)gradients4D[uVar2 + 2] * dz + (double)(int)gradients4D[uVar2 + 3] * dw;
}

Assistant:

static double extrapolate4(struct osn_context* ctx, int xsb, int ysb, int zsb,
    int wsb, double dx, double dy, double dz, double dw)
{
    int16_t* perm = ctx->perm;
    int index =
        perm[(perm[(perm[(perm[xsb & 0xFF] + ysb) & 0xFF] + zsb) & 0xFF] +
                 wsb) &
             0xFF] &
        0xFC;
    return gradients4D[index] * dx + gradients4D[index + 1] * dy +
           gradients4D[index + 2] * dz + gradients4D[index + 3] * dw;
}